

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

void arena_reset_prepare_background_thread(tsd_t *tsd,uint arena_ind)

{
  background_thread_info_t *pbVar1;
  ulong uVar2;
  uint in_ESI;
  background_thread_info_t *info;
  _Bool result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar3;
  malloc_mutex_t *in_stack_ffffffffffffffa0;
  atomic_b_t *tsdn;
  tsdn_t *in_stack_ffffffffffffffa8;
  
  malloc_mutex_lock(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pbVar1 = duckdb_je_background_thread_info;
  tsdn = &duckdb_je_background_thread_enabled_state;
  uVar3 = 0;
  if ((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) {
    uVar2 = (ulong)in_ESI % duckdb_je_max_background_threads;
    malloc_mutex_lock((tsdn_t *)0x0,(malloc_mutex_t *)&duckdb_je_background_thread_enabled_state);
    pbVar1[uVar2].state = background_thread_paused;
    malloc_mutex_unlock((tsdn_t *)tsdn,(malloc_mutex_t *)CONCAT44(uVar3,in_stack_ffffffffffffff98));
  }
  return;
}

Assistant:

static void
arena_reset_prepare_background_thread(tsd_t *tsd, unsigned arena_ind) {
	/* Temporarily disable the background thread during arena reset. */
	if (have_background_thread) {
		malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
		if (background_thread_enabled()) {
			background_thread_info_t *info =
			    background_thread_info_get(arena_ind);
			assert(info->state == background_thread_started);
			malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
			info->state = background_thread_paused;
			malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		}
	}
}